

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O1

ssize_t __thiscall
Intel::i8255::
i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::write
          (i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
           *this,int __fd,void *__buf,size_t __n)

{
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this_00;
  byte bVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  uint8_t value;
  
  value = (uint8_t)__buf;
  switch(__fd & 3) {
  case 0:
    if ((this->control_ & 0x10) == 0) {
      this->outputs_[0] = value;
      this_00 = this->port_handler_->machine_;
      this_00->primary_slots_ = value;
      MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::update_paging(this_00);
      return extraout_RAX;
    }
    break;
  case 1:
    if ((this->control_ & 2) == 0) {
      this->outputs_[1] = value;
      MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
      set_value(this->port_handler_,1,value);
      return extraout_RAX_02;
    }
    break;
  case 2:
    this->outputs_[2] = value;
    MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::set_value
              (this->port_handler_,2,value);
    return extraout_RAX_00;
  case 3:
    if ((char)value < '\0') {
      this->control_ = value;
      update_outputs(this);
      return extraout_RAX_03;
    }
    bVar1 = '\x01' << ((byte)(((ulong)__buf & 0xffffffff) >> 1) & 7);
    if (((ulong)__buf & 1) == 0) {
      this->outputs_[2] = this->outputs_[2] & ~bVar1;
      update_outputs(this);
      return extraout_RAX_01;
    }
    this->outputs_[2] = this->outputs_[2] | bVar1;
    update_outputs(this);
    return extraout_RAX_04;
  }
  return 0x4cd514;
}

Assistant:

void write(int address, uint8_t value) {
			switch(address & 3) {
				case 0:
					if(!(control_ & 0x10)) {
						// TODO: so what would output be when switching from input to output mode?
						outputs_[0] = value; port_handler_.set_value(0, value);
					}
				break;
				case 1:
					if(!(control_ & 0x02)) {
						outputs_[1] = value; port_handler_.set_value(1, value);
					}
				break;
				case 2:	outputs_[2] = value; port_handler_.set_value(2, value);	break;
				case 3:
					if(value & 0x80) {
						control_ = value;
					} else {
						if(value & 1) {
							outputs_[2] |= 1 << ((value >> 1)&7);
						} else {
							outputs_[2] &= ~(1 << ((value >> 1)&7));
						}
					}
					update_outputs();
				break;
			}
		}